

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# profile.hpp
# Opt level: O1

bool __thiscall
ruckig::Profile::
check_for_first_order<(ruckig::Profile::ControlSigns)0,(ruckig::Profile::ReachedLimits)7>
          (Profile *this,double vUp)

{
  double dVar1;
  double dVar2;
  long lVar3;
  double dVar4;
  
  dVar4 = (this->t)._M_elems[3];
  if (0.0 <= dVar4) {
    (this->t_sum)._M_elems[0] = 0.0;
    (this->t_sum)._M_elems[1] = 0.0;
    (this->t_sum)._M_elems[2] = 0.0;
    (this->t_sum)._M_elems[3] = dVar4;
    (this->t_sum)._M_elems[4] = dVar4;
    (this->t_sum)._M_elems[5] = dVar4;
    (this->t_sum)._M_elems[6] = dVar4;
    if (dVar4 <= 1000000000000.0) {
      (this->j)._M_elems[4] = 0.0;
      (this->j)._M_elems[5] = 0.0;
      (this->j)._M_elems[2] = 0.0;
      (this->j)._M_elems[3] = 0.0;
      (this->j)._M_elems[0] = 0.0;
      (this->j)._M_elems[1] = 0.0;
      (this->j)._M_elems[6] = 0.0;
      dVar1 = this->vf;
      dVar2 = this->af;
      (this->a)._M_elems[0] = 0.0;
      (this->a)._M_elems[1] = 0.0;
      (this->a)._M_elems[2] = 0.0;
      (this->a)._M_elems[3] = 0.0;
      (this->a)._M_elems[4] = 0.0;
      (this->a)._M_elems[5] = 0.0;
      (this->a)._M_elems[6] = 0.0;
      (this->a)._M_elems[7] = dVar2;
      (this->v)._M_elems[0] = 0.0;
      (this->v)._M_elems[1] = 0.0;
      (this->v)._M_elems[2] = 0.0;
      (this->v)._M_elems[3] = (double)(-(ulong)(0.0 < dVar4) & (ulong)vUp);
      (this->v)._M_elems[4] = 0.0;
      (this->v)._M_elems[5] = 0.0;
      (this->v)._M_elems[6] = 0.0;
      (this->v)._M_elems[7] = dVar1;
      dVar4 = (this->p)._M_elems[0];
      lVar3 = -0x38;
      do {
        dVar1 = *(double *)((long)(this->t_sum)._M_elems + lVar3);
        dVar4 = dVar4 + (*(double *)((long)(this->a)._M_elems + lVar3 + 0x38) * dVar1 * 0.5 +
                        *(double *)((long)(this->v)._M_elems + lVar3 + 0x38)) * dVar1;
        *(double *)((long)(this->brake).t._M_elems + lVar3 + -8) = dVar4;
        lVar3 = lVar3 + 8;
      } while (lVar3 != 0);
      this->control_signs = UDDU;
      this->limits = NONE;
      this->direction = (uint)(vUp <= 0.0);
      return ABS((this->p)._M_elems[7] - this->pf) < 1e-08;
    }
  }
  return false;
}

Assistant:

bool check_for_first_order(double vUp) {
        // ReachedLimits::VEL
        if (t[3] < 0.0) {
            return false;
        }

        t_sum = {0, 0, 0, t[3], t[3], t[3], t[3]};
        if (t_sum.back() > t_max) { // For numerical reasons, is that needed?
            return false;
        }

        j = {0, 0, 0, 0, 0, 0, 0};
        a = {0, 0, 0, 0, 0, 0, 0, af};
        v = {0, 0, 0, t[3] > 0 ? vUp : 0, 0, 0, 0, vf};
        for (size_t i = 0; i < 7; ++i) {
            p[i+1] = p[i] + t[i] * (v[i] + t[i] * a[i] / 2);
        }

        this->control_signs = control_signs;
        this->limits = limits;

        direction = (vUp > 0) ? Profile::Direction::UP : Profile::Direction::DOWN;

        return std::abs(p.back() - pf) < p_precision;
    }